

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::ProgramUniformCase::test(ProgramUniformCase *this)

{
  TestLog *log;
  char *__s;
  bool bVar1;
  ostream *poVar2;
  GLenum local_6a4;
  GLint local_6a0;
  GLenum type;
  GLint size;
  GLint written;
  char buffer [15];
  GLchar *pGStack_680;
  GLint index;
  char *fragmentSourceCStr;
  string fragmentSource;
  ostringstream frag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  allocator<char> local_441;
  string local_440;
  ScopedLogSection local_420;
  int local_418;
  GLuint local_414;
  int ndx;
  GLuint program;
  GLuint shaderFrag;
  GLuint shaderVert;
  UniformType uniformTypes [18];
  ProgramUniformCase *this_local;
  
  memcpy(&shaderFrag,&DAT_0328f350,0x3f0);
  program = glu::CallLogWrapper::glCreateShader(&(this->super_ApiCase).super_CallLogWrapper,0x8b31);
  ndx = glu::CallLogWrapper::glCreateShader(&(this->super_ApiCase).super_CallLogWrapper,0x8b30);
  local_414 = glu::CallLogWrapper::glCreateProgram(&(this->super_ApiCase).super_CallLogWrapper);
  glu::CallLogWrapper::glAttachShader(&(this->super_ApiCase).super_CallLogWrapper,local_414,program)
  ;
  glu::CallLogWrapper::glAttachShader(&(this->super_ApiCase).super_CallLogWrapper,local_414,ndx);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,program,1,&test::vertSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(&(this->super_ApiCase).super_CallLogWrapper,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  for (local_418 = 0; local_418 < 0x12; local_418 = local_418 + 1) {
    log = (this->super_ApiCase).m_log;
    __s = *(char **)(&shaderFrag + (long)local_418 * 0xe);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,__s,&local_441);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d8,"Verify type of ",(allocator<char> *)&frag.field_0x177);
    std::operator+(&local_4b8,&local_4d8,*(char **)(&shaderFrag + (long)local_418 * 0xe));
    std::operator+(&local_498,&local_4b8," variable");
    std::operator+(&local_478,&local_498,uniformTypes[local_418].declaration);
    tcu::ScopedLogSection::ScopedLogSection(&local_420,log,&local_440,&local_478);
    tcu::ScopedLogSection::~ScopedLogSection(&local_420);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator((allocator<char> *)&frag.field_0x177);
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator(&local_441);
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)(fragmentSource.field_2._M_local_buf + 8));
    poVar2 = std::operator<<((ostream *)(fragmentSource.field_2._M_local_buf + 8),
                             uniformTypes[local_418].precision);
    poVar2 = std::operator<<(poVar2,"uniform ");
    poVar2 = std::operator<<(poVar2,uniformTypes[local_418].postDeclaration);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,*(char **)(&shaderFrag + (long)local_418 * 0xe));
    poVar2 = std::operator<<(poVar2," uniformValue");
    poVar2 = std::operator<<(poVar2,uniformTypes[local_418].declaration);
    std::operator<<(poVar2,";\n");
    std::operator<<((ostream *)((long)&fragmentSource.field_2 + 8),"void main (void)\n");
    std::operator<<((ostream *)((long)&fragmentSource.field_2 + 8),"{\n");
    poVar2 = std::operator<<((ostream *)((long)&fragmentSource.field_2 + 8),"\tgl_FragColor = vec4("
                            );
    poVar2 = std::operator<<(poVar2,uniformTypes[local_418].layout);
    std::operator<<(poVar2,");\n");
    std::operator<<((ostream *)((long)&fragmentSource.field_2 + 8),"}\n");
    std::__cxx11::ostringstream::str();
    pGStack_680 = (GLchar *)std::__cxx11::string::c_str();
    glu::CallLogWrapper::glShaderSource
              (&(this->super_ApiCase).super_CallLogWrapper,ndx,1,&stack0xfffffffffffff980,
               (GLint *)0x0);
    std::__cxx11::string::~string((string *)&fragmentSourceCStr);
    glu::CallLogWrapper::glCompileShader(&(this->super_ApiCase).super_CallLogWrapper,ndx);
    glu::CallLogWrapper::glLinkProgram(&(this->super_ApiCase).super_CallLogWrapper,local_414);
    bVar1 = verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                               m_testCtx,&(this->super_ApiCase).super_CallLogWrapper,local_414,
                               0x8b82,1);
    if (bVar1) {
      stack0xfffffffffffff97c = 0;
      buffer[0] = 't';
      buffer[1] = 'e';
      buffer[2] = 'n';
      buffer[3] = ' ';
      buffer[4] = 't';
      buffer[5] = 'o';
      buffer[6] = '\0';
      _size = 0x69727720746f6e;
      written._3_1_ = 0x74;
      type = 0;
      local_6a0 = 0;
      local_6a4 = 0;
      glu::CallLogWrapper::glGetActiveUniform
                (&(this->super_ApiCase).super_CallLogWrapper,local_414,0,0,(GLsizei *)&type,
                 &local_6a0,&local_6a4,(GLchar *)&size);
      checkIntEquals((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     local_6a4,*(GLint *)&uniformTypes[local_418].getter);
      checkIntEquals((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     local_6a0,*(GLint *)((long)&uniformTypes[local_418].getter + 4));
    }
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)(fragmentSource.field_2._M_local_buf + 8));
  }
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,program);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,ndx);
  glu::CallLogWrapper::glDeleteProgram(&(this->super_ApiCase).super_CallLogWrapper,local_414);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		const struct UniformType
		{
			const char* declaration;
			const char* postDeclaration;
			const char* precision;
			const char* layout;
			const char* getter;
			GLenum		type;
			GLint		size;
			GLint		isRowMajor;
		} uniformTypes[] =
		{
			{ "float",					"",			"highp",	"",				"uniformValue",													GL_FLOAT,							1, GL_FALSE },
			{ "float",					"[2]",		"highp",	"",				"uniformValue[1]",												GL_FLOAT,							2, GL_FALSE },
			{ "vec2",					"",			"highp",	"",				"uniformValue.x",												GL_FLOAT_VEC2,						1, GL_FALSE },
			{ "vec3",					"",			"highp",	"",				"uniformValue.x",												GL_FLOAT_VEC3,						1, GL_FALSE },
			{ "vec4",					"",			"highp",	"",				"uniformValue.x",												GL_FLOAT_VEC4,						1, GL_FALSE },
			{ "int",					"",			"highp",	"",				"float(uniformValue)",											GL_INT,								1, GL_FALSE },
			{ "ivec2",					"",			"highp",	"",				"float(uniformValue.x)",										GL_INT_VEC2,						1, GL_FALSE },
			{ "ivec3",					"",			"highp",	"",				"float(uniformValue.x)",										GL_INT_VEC3,						1, GL_FALSE },
			{ "ivec4",					"",			"highp",	"",				"float(uniformValue.x)",										GL_INT_VEC4,						1, GL_FALSE },
			{ "bool",					"",			"",			"",				"float(uniformValue)",											GL_BOOL,							1, GL_FALSE },
			{ "bvec2",					"",			"",			"",				"float(uniformValue.x)",										GL_BOOL_VEC2,						1, GL_FALSE },
			{ "bvec3",					"",			"",			"",				"float(uniformValue.x)",										GL_BOOL_VEC3,						1, GL_FALSE },
			{ "bvec4",					"",			"",			"",				"float(uniformValue.x)",										GL_BOOL_VEC4,						1, GL_FALSE },
			{ "mat2",					"",			"highp",	"",				"float(uniformValue[0][0])",									GL_FLOAT_MAT2,						1, GL_FALSE },
			{ "mat3",					"",			"highp",	"",				"float(uniformValue[0][0])",									GL_FLOAT_MAT3,						1, GL_FALSE },
			{ "mat4",					"",			"highp",	"",				"float(uniformValue[0][0])",									GL_FLOAT_MAT4,						1, GL_FALSE },
			{ "sampler2D",				"",			"highp",	"",				"float(texture2D(uniformValue, vec2(0.0, 0.0)).r)",				GL_SAMPLER_2D,						1, GL_FALSE },
			{ "samplerCube",			"",			"highp",	"",				"float(textureCube(uniformValue, vec3(0.0, 0.0, 0.0)).r)",		GL_SAMPLER_CUBE,					1, GL_FALSE },
		};

		static const char* vertSource =
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(0.0);\n"
			"}\n\0";

		GLuint shaderVert	= glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag	= glCreateShader(GL_FRAGMENT_SHADER);
		GLuint program		= glCreateProgram();

		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);

		glShaderSource(shaderVert, 1, &vertSource, DE_NULL);
		glCompileShader(shaderVert);
		expectError(GL_NO_ERROR);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(uniformTypes); ++ndx)
		{
			tcu::ScopedLogSection(m_log, uniformTypes[ndx].declaration, std::string("Verify type of ") + uniformTypes[ndx].declaration + " variable" + uniformTypes[ndx].postDeclaration );

			// gen fragment shader

			std::ostringstream frag;
			frag << uniformTypes[ndx].layout << "uniform " << uniformTypes[ndx].precision << " " << uniformTypes[ndx].declaration << " uniformValue" << uniformTypes[ndx].postDeclaration << ";\n";
			frag << "void main (void)\n";
			frag << "{\n";
			frag << "	gl_FragColor = vec4(" << uniformTypes[ndx].getter << ");\n";
			frag << "}\n";

			{
				std::string fragmentSource = frag.str();
				const char* fragmentSourceCStr = fragmentSource.c_str();
				glShaderSource(shaderFrag, 1, &fragmentSourceCStr, DE_NULL);
			}

			// compile & link

			glCompileShader(shaderFrag);
			glLinkProgram(program);

			// test
			if (verifyProgramParam(m_testCtx, *this, program, GL_LINK_STATUS, GL_TRUE))
			{
				const GLint index = 0; // first and only active uniform

				char buffer[]	= "not written to"; // not written to
				GLint written	= 0;
				GLint size		= 0;
				GLenum type		= 0;
				glGetActiveUniform(program, index, 0, &written, &size, &type, buffer);

				checkIntEquals(m_testCtx, type, uniformTypes[ndx].type);
				checkIntEquals(m_testCtx, size, uniformTypes[ndx].size);
			}
		}

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}